

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5PoslistOffsetsCallback(Fts5Index *pUnused,void *pContext,u8 *pChunk,int nChunk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVal;
  undefined8 uStack_38;
  
  if (0 < nChunk) {
    uVar8 = 0;
    uStack_38 = in_RAX;
    do {
      iVar2 = sqlite3Fts5GetVarint32(pChunk + uVar8,(u32 *)((long)&uStack_38 + 4));
      iVar3 = *(int *)((long)pContext + 0x10);
      iVar1 = uStack_38._4_4_;
      iVar6 = uStack_38._4_4_ + iVar3 + -2;
      uStack_38 = CONCAT44(iVar6,(undefined4)uStack_38);
      *(int *)((long)pContext + 0x10) = iVar6;
      lVar4 = (long)**(int **)((long)pContext + 8);
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          if ((*(int **)((long)pContext + 8))[lVar5 + 1] == iVar6) {
            iVar3 = sqlite3Fts5PutVarint
                              ((uchar *)((long)(int)(*pContext)[1] + **pContext),
                               (long)((iVar1 + iVar3) - *(int *)((long)pContext + 0x14)));
            *(int *)(*pContext + 8) = *(int *)(*pContext + 8) + iVar3;
            *(int *)((long)pContext + 0x14) = iVar6;
            break;
          }
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      uVar7 = (int)uVar8 + iVar2;
      uVar8 = (ulong)uVar7;
    } while ((int)uVar7 < nChunk);
  }
  return;
}

Assistant:

static void fts5PoslistOffsetsCallback(
  Fts5Index *pUnused, 
  void *pContext, 
  const u8 *pChunk, int nChunk
){
  PoslistOffsetsCtx *pCtx = (PoslistOffsetsCtx*)pContext;
  UNUSED_PARAM(pUnused);
  assert_nc( nChunk>=0 );
  if( nChunk>0 ){
    int i = 0;
    while( i<nChunk ){
      int iVal;
      i += fts5GetVarint32(&pChunk[i], iVal);
      iVal += pCtx->iRead - 2;
      pCtx->iRead = iVal;
      if( fts5IndexColsetTest(pCtx->pColset, iVal) ){
        fts5BufferSafeAppendVarint(pCtx->pBuf, iVal + 2 - pCtx->iWrite);
        pCtx->iWrite = iVal;
      }
    }
  }
}